

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

void __thiscall Market::match(Market *this,Order *bid,Order *ask)

{
  double price;
  long quantity;
  
  price = ask->m_price;
  quantity = ask->m_openQuantity;
  if (bid->m_openQuantity < ask->m_openQuantity) {
    quantity = bid->m_openQuantity;
  }
  Order::execute(bid,price,quantity);
  Order::execute(ask,price,quantity);
  return;
}

Assistant:

void Market::match(Order &bid, Order &ask) {
  double price = ask.getPrice();
  long quantity = 0;

  if (bid.getOpenQuantity() > ask.getOpenQuantity()) {
    quantity = ask.getOpenQuantity();
  } else {
    quantity = bid.getOpenQuantity();
  }

  bid.execute(price, quantity);
  ask.execute(price, quantity);
}